

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

DrawResult * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::BaseTestInstance::draw
          (DrawResult *__return_storage_ptr__,BaseTestInstance *this,deUint32 vertexCount,
          vector<float,_std::allocator<float>_> *patchTessLevels,Winding winding,bool usePointMode)

{
  int iVar1;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  Allocation *pAVar3;
  int *memory;
  TestLog *pTVar4;
  DrawResult *pDVar5;
  int iVar6;
  int iVar7;
  DeviceInterface *vk;
  VkDevice device;
  GraphicsPipelineBuilder *pGVar8;
  ProgramBinary *pPVar9;
  _func_bool_PerPrimitive_ptr_PerPrimitive_ptr *pred;
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *unsorted;
  int stride;
  allocator<char> local_2dc;
  allocator<char> local_2db;
  allocator<char> local_2da;
  allocator<char> local_2d9;
  tessellation *local_2d8;
  deUint32 local_2d0;
  Winding local_2cc;
  string local_2c8;
  DrawResult *local_2a8;
  VkQueue local_2a0;
  string local_298;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  VkDeviceSize vertexBufferOffset;
  Handle<(vk::HandleType)14> HStack_1b0;
  pointer local_1a8;
  deUint32 local_bc;
  bool local_b8;
  VkPrimitiveTopology local_b4;
  
  local_2d8 = (tessellation *)patchTessLevels;
  local_2d0 = vertexCount;
  local_2cc = winding;
  local_2a8 = __return_storage_ptr__;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_2a0 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  memset((GraphicsPipelineBuilder *)&vertexBufferOffset,0,0xfc);
  local_b8 = false;
  local_b4 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_bc = 6;
  pGVar8 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                     ((GraphicsPipelineBuilder *)&vertexBufferOffset,this->m_vertexFormat,
                      this->m_vertexStride);
  pPVar2 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"vert",&local_2d9);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_298);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_VERTEX_BIT,pPVar9,(VkSpecializationInfo *)0x0
                     );
  pPVar2 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"tesc",&local_2da);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_1d8);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar9,
                      (VkSpecializationInfo *)0x0);
  pPVar2 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"tese",&local_2db);
  getProgramName(&local_1f8,&local_218,local_2cc,usePointMode);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_1f8);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar9,
                      (VkSpecializationInfo *)0x0);
  pPVar2 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"geom",&local_2dc);
  getProgramName(&local_238,&local_258,usePointMode);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_238);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar9,
                      (VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_2c8,pGVar8,vk,device,
             (VkPipelineLayout)
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal);
  local_278.m_data.deleter.m_device = (VkDevice)local_2c8.field_2._M_allocated_capacity;
  local_278.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_2c8.field_2._8_8_;
  local_278.m_data.object.m_internal = (deUint64)local_2c8._M_dataplus._M_p;
  local_278.m_data.deleter.m_deviceIface = (DeviceInterface *)local_2c8._M_string_length;
  local_2c8._M_dataplus._M_p = (pointer)0x0;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_allocated_capacity = 0;
  local_2c8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_298);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)&vertexBufferOffset);
  pAVar3 = (this->m_resultBuffer).m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset(pAVar3->m_hostPtr,0,this->m_resultBufferSizeBytes);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,
             this->m_resultBufferSizeBytes);
  beginCommandBuffer(vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  beginRenderPassWithRasterizationDisabled
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkFramebuffer)
             (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             local_278.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,0,1,&this->m_descriptorSet,0,0);
  vertexBufferOffset = 0;
  (*vk->_vptr_DeviceInterface[0x58])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  (*vk->_vptr_DeviceInterface[0x59])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)local_2d0,1,0,0);
  endRenderPass(vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&vertexBufferOffset,0x40,0x2000,
             (VkBuffer)
             (this->m_resultBuffer).m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
             object.m_internal,0,this->m_resultBufferSizeBytes);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x8000,
             0x4000,0,0,0,1,(VkBufferMemoryBarrier *)&vertexBufferOffset,0,0);
  endCommandBuffer(vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  submitCommandsAndWait
            (vk,device,local_2a0,
             (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pAVar3 = (this->m_resultBuffer).m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,
             this->m_resultBufferSizeBytes);
  pDVar5 = local_2a8;
  (local_2a8->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2a8->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2a8->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8->success = true;
  stride = this->m_numPatchesToDraw;
  iVar6 = multiplePatchReferencePrimitiveCount
                    ((this->m_caseDef).primitiveType,(this->m_caseDef).spacingMode,usePointMode,
                     *(float **)local_2d8,stride);
  pDVar5->refNumPrimitives = iVar6;
  iVar7 = numVerticesPerPrimitive((this->m_caseDef).primitiveType,usePointMode);
  pDVar5->numPrimitiveVertices = iVar7;
  memory = (int *)pAVar3->m_hostPtr;
  iVar7 = *memory;
  pDVar5->numPrimitives = iVar7;
  pred = (_func_bool_PerPrimitive_ptr_PerPrimitive_ptr *)
         (ulong)(uint)this->m_resultBufferPrimitiveDataOffset;
  readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
            ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              *)&local_298,iVar7,memory,this->m_resultBufferPrimitiveDataOffset,stride);
  sorted<vkt::tessellation::(anonymous_namespace)::PerPrimitive,bool(*)(vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&,vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&)>
            ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              *)&local_2c8,(tessellation *)&local_298,unsorted,pred);
  (pDVar5->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2c8._M_dataplus._M_p;
  (pDVar5->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2c8._M_string_length;
  (pDVar5->primitives).
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_2c8.field_2._M_allocated_capacity;
  vertexBufferOffset = 0;
  HStack_1b0.m_internal = 0;
  local_1a8 = (pointer)0x0;
  local_2c8._M_dataplus._M_p = (pointer)0x0;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_allocated_capacity = 0;
  std::
  _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ::~_Vector_base((_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                   *)&vertexBufferOffset);
  std::
  _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ::~_Vector_base((_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                   *)&local_2c8);
  std::
  _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ::~_Vector_base((_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                   *)&local_298);
  if (iVar7 != iVar6) {
    pTVar4 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    iVar1 = this->m_numPatchesToDraw;
    vertexBufferOffset = (VkDeviceSize)pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_1b0);
    std::operator<<((ostream *)&HStack_1b0,"Failure: the number of generated primitives is ");
    std::ostream::operator<<((ostringstream *)&HStack_1b0,iVar7);
    std::operator<<((ostream *)&HStack_1b0,", expected at least ");
    std::ostream::operator<<((ostringstream *)&HStack_1b0,iVar6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&HStack_1b0);
    if (iVar1 == 1) {
      vertexBufferOffset = (VkDeviceSize)pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_1b0);
      std::operator<<((ostream *)&HStack_1b0,
                      "Note: rendered one patch; tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                     );
      containerStr<std::vector<float,std::allocator<float>>>
                (&local_2c8,local_2d8,(vector<float,_std::allocator<float>_> *)0x6,0,stride);
      std::operator<<((ostream *)&HStack_1b0,(string *)&local_2c8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
    }
    else {
      vertexBufferOffset = (VkDeviceSize)pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_1b0);
      std::operator<<((ostream *)&HStack_1b0,"Note: rendered ");
      std::ostream::operator<<((ostringstream *)&HStack_1b0,iVar1);
      std::operator<<((ostream *)&HStack_1b0," patches in one draw call; ");
      std::operator<<((ostream *)&HStack_1b0,
                      "tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                     );
      containerStr<std::vector<float,std::allocator<float>>>
                (&local_2c8,local_2d8,(vector<float,_std::allocator<float>_> *)0x6,0,stride);
      std::operator<<((ostream *)&HStack_1b0,(string *)&local_2c8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
    }
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&HStack_1b0);
    pDVar5->success = false;
  }
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_278);
  return pDVar5;
}

Assistant:

BaseTestInstance::DrawResult BaseTestInstance::draw (const deUint32 vertexCount, const std::vector<float>& patchTessLevels, const Winding winding, const bool usePointMode)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();
	const VkQueue			queue	= m_context.getUniversalQueue();

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setPatchControlPoints        (NUM_TESS_LEVELS)
		.setVertexInputSingleAttribute(m_vertexFormat, m_vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(getProgramName("tese", winding, usePointMode)), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,                m_context.getBinaryCollection().get(getProgramName("geom", usePointMode)), DE_NULL)
		.build                        (vk, device, *m_pipelineLayout, *m_renderPass));

	{
		const Allocation& alloc = m_resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(m_resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_resultBufferSizeBytes);
	}

	beginCommandBuffer(vk, *m_cmdBuffer);
	beginRenderPassWithRasterizationDisabled(vk, *m_cmdBuffer, *m_renderPass, *m_framebuffer);

	vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*m_cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*m_cmdBuffer, vertexCount, 1u, 0u, 0u);
	endRenderPass(vk, *m_cmdBuffer);

	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *m_resultBuffer, 0ull, m_resultBufferSizeBytes);

		vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *m_cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);

	// Read back and check results

	const Allocation& resultAlloc = m_resultBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), m_resultBufferSizeBytes);

	DrawResult result;
	result.success				= true;
	result.refNumPrimitives     = multiplePatchReferencePrimitiveCount(m_caseDef.primitiveType, m_caseDef.spacingMode, usePointMode, &patchTessLevels[0], m_numPatchesToDraw);
	result.numPrimitiveVertices = numVerticesPerPrimitive(m_caseDef.primitiveType, usePointMode);
	result.numPrimitives        = *static_cast<deInt32*>(resultAlloc.getHostPtr());
	result.primitives           = sorted(readInterleavedData<PerPrimitive>(result.numPrimitives, resultAlloc.getHostPtr(), m_resultBufferPrimitiveDataOffset, sizeof(PerPrimitive)),
										 byPatchPrimitiveID);

	// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
	DE_ASSERT(result.numPrimitives <= m_maxNumPrimitivesInDrawCall);

	tcu::TestLog& log = m_context.getTestContext().getLog();
	if (result.numPrimitives != result.refNumPrimitives)
	{
		logPrimitiveCountError(log, m_numPatchesToDraw, result.numPrimitives, result.refNumPrimitives, patchTessLevels);
		result.success = false;
	}
	return result;
}